

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_init_var_test(void)

{
  btree_kv_ops *__ptr;
  char local_d8 [16];
  char local_c8 [8];
  undefined8 uStackY_c0;
  uint8_t local_b7;
  btree_kv_ops *in_stack_ffffffffffffff50;
  uint8_t vsize;
  uint8_t ksize;
  btree *tree;
  btree_kv_ops *kv_ops;
  void *value;
  void *key;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  uStackY_c0 = 0x101c58;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStackY_c0 = 0x101c6d;
  memleak_start();
  uStackY_c0 = 0x101c76;
  __ptr = btree_str_kv_get_kb64_vb64(in_stack_ffffffffffffff50);
  uStackY_c0 = 0x101cb3;
  (*__ptr->init_kv_var)((btree *)&stack0xffffffffffffff48,(void *)0x0,(void *)0x0);
  local_b7 = '\b';
  (*__ptr->init_kv_var)((btree *)&stack0xffffffffffffff48,local_c8,local_d8);
  if (local_c8[0] != '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0xc3);
    kv_init_var_test::__test_pass = 0;
    if (local_c8[0] != '\0') {
      __assert_fail("*(uint8_t *)key == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0xc3,"void kv_init_var_test()");
    }
  }
  if (local_d8[0] != '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0xc4);
    kv_init_var_test::__test_pass = 0;
    if (local_d8[0] != '\0') {
      __assert_fail("*(uint8_t *)value == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0xc4,"void kv_init_var_test()");
    }
  }
  free(__ptr);
  memleak_end();
  if (kv_init_var_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv init var test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv init var test");
  }
  return;
}

Assistant:

void kv_init_var_test()
{
    TEST_INIT();
    memleak_start();

    void *key, *value;
    btree_kv_ops *kv_ops = btree_str_kv_get_kb64_vb64(NULL);
    btree *tree = alca(struct btree, 1);
    uint8_t ksize = sizeof(void *);
    uint8_t vsize = 8;

    // unintialized key/value
    key = NULL;
    value = NULL;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK(key == NULL);
    TEST_CHK(value == NULL);

    // initialized
    key = (void *)alca(uint8_t, ksize);
    value = (void *)alca(uint8_t, vsize);
    tree->vsize = vsize;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK( *(uint8_t *)key == 0 );
    TEST_CHK( *(uint8_t *)value == 0 );

    free(kv_ops);
    memleak_end();
    TEST_RESULT("kv init var test");
}